

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

uint qt_gradient_pixel_fixed(QGradientData *data,int fixed_pos)

{
  QRgb *pQVar1;
  uint uVar2;
  
  pQVar1 = data->colorTable32;
  uVar2 = qt_gradient_clamp(data,fixed_pos + 0x80 >> 8);
  return pQVar1[uVar2];
}

Assistant:

static uint qt_gradient_pixel_fixed(const QGradientData *data, int fixed_pos)
{
    int ipos = (fixed_pos + (FIXPT_SIZE / 2)) >> FIXPT_BITS;
    return data->colorTable32[qt_gradient_clamp(data, ipos)];
}